

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stmt.h
# Opt level: O2

void __thiscall enact::ContinueStmt::~ContinueStmt(ContinueStmt *this)

{
  (this->super_Stmt)._vptr_Stmt = (_func_int **)&PTR__ContinueStmt_00124208;
  std::__cxx11::string::~string((string *)&(this->keyword).lexeme);
  return;
}

Assistant:

~ContinueStmt() override = default;